

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

KeyFormatData *
cfd::core::GetKeyFormatFromVersion(KeyFormatData *__return_storage_ptr__,uint32_t version)

{
  bool bVar1;
  CfdException *this;
  _Alloc_hider this_00;
  allocator local_41;
  string local_40;
  
  GetKeyFormatList();
  this_00._M_p = local_40._M_dataplus._M_p;
  while( true ) {
    if (this_00._M_p == (pointer)local_40._M_string_length) {
      ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                 &local_40);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&local_40,"unsupported extkey version.",&local_41);
      CfdException::CfdException(this,kCfdIllegalArgumentError,&local_40);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar1 = KeyFormatData::IsFindVersion((KeyFormatData *)this_00._M_p,version);
    if (bVar1) break;
    this_00._M_p = this_00._M_p + 0x78;
  }
  KeyFormatData::KeyFormatData(__return_storage_ptr__,(KeyFormatData *)this_00._M_p);
  ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
            ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
             &local_40);
  return __return_storage_ptr__;
}

Assistant:

static KeyFormatData GetKeyFormatFromVersion(uint32_t version) {
  for (const auto& format_data : GetKeyFormatList()) {
    if (format_data.IsFindVersion(version)) {
      return format_data;
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "unsupported extkey version.");
}